

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Metadata.cpp
# Opt level: O0

TextBasedDMFramework * __thiscall
ASDCP::MXF::TextBasedDMFramework::WriteToTLVSet(TextBasedDMFramework *this,TLVWriter *TLVSet)

{
  bool bVar1;
  int iVar2;
  MDDEntry *Object;
  MDDEntry *in_RDX;
  TLVWriter local_a0;
  undefined1 local_21;
  MDDEntry *local_20;
  TLVWriter *TLVSet_local;
  TextBasedDMFramework *this_local;
  Result_t *result;
  
  TLVSet_local = TLVSet;
  this_local = this;
  if (TLVSet[1].super_MemIOWriter.m_p == (byte_t *)0x0) {
    __assert_fail("m_Dict",
                  "/workspace/llm4binary/github/license_c_cmakelists/cinecert[P]asdcplib/src/Metadata.cpp"
                  ,0x1266,
                  "virtual ASDCP::Result_t ASDCP::MXF::TextBasedDMFramework::WriteToTLVSet(TLVWriter &)"
                 );
  }
  local_21 = 0;
  local_20 = in_RDX;
  DescriptiveFramework::WriteToTLVSet(&this->super_DescriptiveFramework,TLVSet);
  iVar2 = Kumu::Result_t::operator_cast_to_int((Result_t *)this);
  if ((-1 < iVar2) &&
     (bVar1 = optional_property<Kumu::UUID>::empty
                        ((optional_property<Kumu::UUID> *)
                         &TLVSet[2].m_ElementMap._M_t._M_impl.super__Rb_tree_header._M_node_count),
     !bVar1)) {
    Object = Dictionary::Type((Dictionary *)TLVSet[1].super_MemIOWriter.m_p,
                              MDD_TextBasedDMFramework_ObjectRef);
    optional_property<Kumu::UUID>::get
              ((optional_property<Kumu::UUID> *)
               &TLVSet[2].m_ElementMap._M_t._M_impl.super__Rb_tree_header._M_node_count);
    TLVWriter::WriteObject(&local_a0,local_20,(IArchive *)Object);
    Kumu::Result_t::operator=((Result_t *)this,(Result_t *)&local_a0);
    Kumu::Result_t::~Result_t((Result_t *)&local_a0);
  }
  return this;
}

Assistant:

ASDCP::Result_t
TextBasedDMFramework::WriteToTLVSet(TLVWriter& TLVSet)
{
  assert(m_Dict);
  Result_t result = DescriptiveFramework::WriteToTLVSet(TLVSet);
  if ( ASDCP_SUCCESS(result)  && ! ObjectRef.empty() ) result = TLVSet.WriteObject(OBJ_WRITE_ARGS_OPT(TextBasedDMFramework, ObjectRef));
  return result;
}